

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

bool __thiscall QVariant::convert(QVariant *this,QMetaType targetType)

{
  bool bVar1;
  long in_RDI;
  long in_FS_OFFSET;
  bool ok;
  QVariant oldValue;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  QVariant *in_stack_ffffffffffffff38;
  QMetaType in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  QMetaType in_stack_ffffffffffffff58;
  bool local_59;
  QMetaType local_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  QMetaType toType;
  QMetaType fromType;
  
  fromType.d_ptr = *(QMetaTypeInterface **)(in_FS_OFFSET + 0x28);
  Private::type((Private *)
                CONCAT17(in_stack_ffffffffffffff37,
                         CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
  bVar1 = ::operator==((QMetaType *)
                       CONCAT17(in_stack_ffffffffffffff37,
                                CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
                       (QMetaType *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (bVar1) {
    local_59 = QMetaType::isValid(&local_30);
  }
  else {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    toType.d_ptr = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    QVariant((QVariant *)
             CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
             (QVariant *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    clear((QVariant *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    create(in_stack_ffffffffffffff38,in_stack_ffffffffffffff48,
           (void *)CONCAT17(in_stack_ffffffffffffff37,
                            CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
    bVar1 = canConvert(in_stack_ffffffffffffff38,in_stack_ffffffffffffff48);
    if (bVar1) {
      bVar1 = false;
      if (((ulong)toType.d_ptr >> 1 & 1) != 0) {
        in_stack_ffffffffffffff58 =
             Private::type((Private *)
                           CONCAT17(in_stack_ffffffffffffff37,
                                    CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
        in_stack_ffffffffffffff54 =
             QMetaType::id((QMetaType *)
                           CONCAT17(in_stack_ffffffffffffff37,
                                    CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
                           in_stack_ffffffffffffff2c);
        bVar1 = in_stack_ffffffffffffff54 != 0x33;
      }
      if (bVar1) {
        local_59 = false;
      }
      else {
        Private::type((Private *)
                      CONCAT17(in_stack_ffffffffffffff37,
                               CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
        constData((QVariant *)0x437f58);
        data((QVariant *)
             CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
        in_stack_ffffffffffffff37 =
             QMetaType::convert(fromType,in_stack_ffffffffffffff58.d_ptr,toType,
                                (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50
                                                ));
        *(ulong *)(in_RDI + 0x18) =
             *(ulong *)(in_RDI + 0x18) & 0xfffffffffffffffd |
             (ulong)((in_stack_ffffffffffffff37 ^ 0xff) & 1) << 1;
        local_59 = (bool)in_stack_ffffffffffffff37;
      }
    }
    else {
      local_59 = false;
    }
    ~QVariant((QVariant *)
              CONCAT17(in_stack_ffffffffffffff37,
                       CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
  }
  if (*(QMetaTypeInterface **)(in_FS_OFFSET + 0x28) == fromType.d_ptr) {
    return local_59;
  }
  __stack_chk_fail();
}

Assistant:

bool QVariant::convert(QMetaType targetType)
{
    if (d.type() == targetType)
        return targetType.isValid();

    QVariant oldValue = *this;

    clear();
    create(targetType, nullptr);
    if (!oldValue.canConvert(targetType))
        return false;

    // Fail if the value is not initialized or was forced null by a previous failed convert.
    if (oldValue.d.is_null && oldValue.d.type().id() != QMetaType::Nullptr)
        return false;

    bool ok = QMetaType::convert(oldValue.d.type(), oldValue.constData(), targetType, data());
    d.is_null = !ok;
    return ok;
}